

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O1

bool bssl::ssl_get_new_session(SSL_HANDSHAKE *hs)

{
  byte bVar1;
  SSL *ssl;
  ssl_ctx_st *psVar2;
  CERT *pCVar3;
  _Head_base<0UL,_ssl_session_st_*,_false> __p_00;
  uint16_t uVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  bool bVar8;
  pointer __p;
  OPENSSL_timeval OVar9;
  UniquePtr<SSL_SESSION> session;
  _Head_base<0UL,_ssl_session_st_*,_false> local_38;
  SSL_X509_METHOD *local_30;
  
  ssl = hs->ssl;
  if ((ssl->mode & 0x200) != 0) {
    ERR_put_error(0x10,0,0xd1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                  ,0xdd);
    return false;
  }
  local_30 = ((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method;
  local_38._M_head_impl = New<ssl_session_st,bssl::SSL_X509_METHOD_const*&>(&local_30);
  if (local_38._M_head_impl == (ssl_session_st *)0x0) {
    bVar8 = false;
  }
  else {
    (local_38._M_head_impl)->field_0x1b8 =
         (local_38._M_head_impl)->field_0x1b8 & 0xef | (ssl->field_0xa4 & 1) << 4;
    (local_38._M_head_impl)->ssl_version = ssl->s3->version;
    iVar5 = SSL_is_quic(ssl);
    (local_38._M_head_impl)->field_0x1b8 =
         (local_38._M_head_impl)->field_0x1b8 & 0xdf | (iVar5 != 0) << 5;
    OVar9 = ssl_ctx_get_current_time
                      ((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    (local_38._M_head_impl)->time = OVar9.tv_sec;
    uVar4 = ssl_protocol_version(ssl);
    __p_00._M_head_impl = local_38._M_head_impl;
    psVar2 = (ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
             .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    if (uVar4 < 0x304) {
      uVar6 = psVar2->session_timeout;
      uVar7 = uVar6;
    }
    else {
      uVar6 = psVar2->session_psk_dhe_timeout;
      uVar7 = 0x93a80;
    }
    (local_38._M_head_impl)->timeout = uVar6;
    (local_38._M_head_impl)->auth_timeout = uVar7;
    pCVar3 = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t
             .super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
    bVar1 = (pCVar3->sid_ctx).size_;
    if ((ulong)bVar1 < 0x21) {
      ((local_38._M_head_impl)->sid_ctx).size_ = '\0';
      if (bVar1 != 0) {
        memmove(&(local_38._M_head_impl)->sid_ctx,&pCVar3->sid_ctx,(ulong)bVar1);
      }
      ((__p_00._M_head_impl)->sid_ctx).size_ = bVar1;
      if (bVar1 < 0x21) {
        (__p_00._M_head_impl)->field_0x1b8 = (__p_00._M_head_impl)->field_0x1b8 | 4;
        (__p_00._M_head_impl)->verify_result = 0x41;
        local_38._M_head_impl = (ssl_session_st *)0x0;
        std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)&hs->new_session,
                   __p_00._M_head_impl);
        bVar8 = true;
        ssl_set_session(ssl,(SSL_SESSION *)0x0);
        goto LAB_0026b9dd;
      }
    }
    bVar8 = false;
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                  ,0xfc);
  }
LAB_0026b9dd:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_38);
  return bVar8;
}

Assistant:

bool ssl_get_new_session(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  if (ssl->mode & SSL_MODE_NO_SESSION_CREATION) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SESSION_MAY_NOT_BE_CREATED);
    return false;
  }

  UniquePtr<SSL_SESSION> session = ssl_session_new(ssl->ctx->x509_method);
  if (session == NULL) {
    return false;
  }

  session->is_server = ssl->server;
  session->ssl_version = ssl->s3->version;
  session->is_quic = SSL_is_quic(ssl);

  // Fill in the time from the |SSL_CTX|'s clock.
  OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
  session->time = now.tv_sec;

  uint16_t version = ssl_protocol_version(ssl);
  if (version >= TLS1_3_VERSION) {
    // TLS 1.3 uses tickets as authenticators, so we are willing to use them for
    // longer.
    session->timeout = ssl->session_ctx->session_psk_dhe_timeout;
    session->auth_timeout = SSL_DEFAULT_SESSION_AUTH_TIMEOUT;
  } else {
    // TLS 1.2 resumption does not incorporate new key material, so we use a
    // much shorter timeout.
    session->timeout = ssl->session_ctx->session_timeout;
    session->auth_timeout = ssl->session_ctx->session_timeout;
  }

  if (!session->sid_ctx.TryCopyFrom(hs->config->cert->sid_ctx)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // The session is marked not resumable until it is completely filled in.
  session->not_resumable = true;
  session->verify_result = X509_V_ERR_INVALID_CALL;

  hs->new_session = std::move(session);
  ssl_set_session(ssl, NULL);
  return true;
}